

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O0

void run_test_get_put(VMEMcache *cache,uint n_threads,os_thread_t *threads,uint ops_per_thread,
                     context *ctx)

{
  uint uVar1;
  uint uVar2;
  uint local_3c;
  uint i;
  uint start;
  uint n_puts;
  context *ctx_local;
  uint ops_per_thread_local;
  os_thread_t *threads_local;
  uint n_threads_local;
  VMEMcache *cache_local;
  
  init_test_get(cache,n_threads,threads,ops_per_thread,ctx);
  if (n_threads < 10) {
    ctx[n_threads >> 1].worker = worker_thread_put_in_gets;
  }
  else {
    uVar1 = (n_threads << 1) / 10;
    uVar2 = (n_threads >> 1) - (uVar1 >> 1);
    for (local_3c = uVar2; local_3c < uVar2 + uVar1; local_3c = local_3c + 1) {
      ctx[local_3c].worker = worker_thread_put_in_gets;
    }
  }
  vmemcache_callback_on_miss(cache,on_miss_cb,ctx);
  printf("%s: STARTED\n","run_test_get_put");
  run_threads(n_threads,threads,ctx);
  printf("%s: PASSED\n","run_test_get_put");
  return;
}

Assistant:

static void
run_test_get_put(VMEMcache *cache, unsigned n_threads, os_thread_t *threads,
		unsigned ops_per_thread, struct context *ctx)
{
	init_test_get(cache, n_threads, threads, ops_per_thread, ctx);

	if (n_threads < 10) {
		ctx[n_threads >> 1].worker = worker_thread_put_in_gets;
	} else {
		/* 20% of threads (in the middle of their array) are puts */
		unsigned n_puts = (2 * n_threads) / 10; /* 20% of threads */
		unsigned start = (n_threads / 2) - (n_puts / 2);
		for (unsigned i = start; i < start + n_puts; i++)
			ctx[i].worker = worker_thread_put_in_gets;
	}

	vmemcache_callback_on_miss(cache, on_miss_cb, ctx);

	printf("%s: STARTED\n", __func__);

	run_threads(n_threads, threads, ctx);

	printf("%s: PASSED\n", __func__);
}